

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmaster.c
# Opt level: O3

err_t RenderData(ebml_master *Element,stream *Output,bool_t bForceWithoutMandatory,
                bool_t bWithDefault,int ForProfile,filepos_t *Rendered)

{
  code *pcVar1;
  bool_t bVar2;
  bool_t bVar3;
  ebml_context *Context;
  ebml_crc *peVar4;
  long lVar5;
  err_t eVar6;
  filepos_t fVar7;
  stream *Output_00;
  size_t *Rendered_00;
  filepos_t CrcSize;
  uint8_t *Data;
  size_t Written;
  filepos_t _Rendered;
  long local_78;
  bool_t local_70;
  array local_68;
  ebml_crc *local_50;
  long local_48;
  size_t local_40;
  size_t local_38;
  
  Rendered_00 = &local_38;
  if (Rendered != (filepos_t *)0x0) {
    Rendered_00 = (size_t *)Rendered;
  }
  *Rendered_00 = 0;
  if ((bForceWithoutMandatory == 0) &&
     (bVar2 = CheckMandatory(Element,bWithDefault,ForProfile), bVar2 == 0)) {
    __assert_fail("CheckMandatory((ebml_master*)Element, bWithDefault, ForProfile)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                  ,0x1d9,
                  "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                 );
  }
  if (Element->CheckSumStatus == 0) {
    eVar6 = InternalRender((ebml_master *)(Element->Base).Base.Children,Output,
                           bForceWithoutMandatory,bWithDefault,ForProfile,(filepos_t *)Rendered_00);
    return eVar6;
  }
  local_70 = bWithDefault;
  bVar2 = Node_IsPartOf(Output,0x534d454d);
  local_68._Begin = (char *)0x0;
  local_68._Used = 0;
  if ((bVar2 != 0) || (bVar3 = ArrayResize(&local_68,(Element->Base).DataSize - 6,0), bVar3 != 0)) {
    Context = EBML_getContextEbmlCrc32();
    peVar4 = (ebml_crc *)EBML_ElementCreate(Element,Context,0,ForProfile);
    bVar3 = local_70;
    if (peVar4 != (ebml_crc *)0x0) {
      local_50 = peVar4;
      if (bVar2 == 0) {
        Output_00 = (stream *)NodeCreate(Element,0x534d454d);
        if (Output_00 == (stream *)0x0) {
          eVar6 = -2;
        }
        else {
          if (Output == (stream *)0x0) {
            __assert_fail("(const void*)(Output)!=NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                          ,0x1fb,
                          "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                         );
          }
          local_78 = (**(code **)((long)(Output->Base).VMT + 0x78))(Output,0,1);
          local_78 = local_78 + 6;
          (**(code **)((long)(Output_00->Base).VMT + 0x20))
                    (Output_00,0x100,local_68._Begin,local_68._Used);
          (**(code **)((long)(Output_00->Base).VMT + 0x20))(Output_00,0x102,&local_78,8);
          eVar6 = InternalRender((ebml_master *)(Element->Base).Base.Children,Output_00,
                                 bForceWithoutMandatory,local_70,ForProfile,(filepos_t *)Rendered_00
                                );
          peVar4 = local_50;
          if (eVar6 == 0) {
            if (*Rendered_00 != local_68._Used) {
              __assert_fail("Err!=ERR_NONE || *Rendered == (filepos_t)ARRAYCOUNT(TmpBuf,uint8_t)",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                            ,0x1ff,
                            "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                           );
            }
            EBML_CRCAddBuffer(local_50,local_68._Begin,*Rendered_00);
            EBML_CRCFinalize(peVar4);
            eVar6 = EBML_ElementRender(&peVar4->Base,Output,local_70,0,bForceWithoutMandatory,
                                       ForProfile,&local_48);
            if (eVar6 == 0) {
              eVar6 = (**(code **)((long)(Output->Base).VMT + 0x70))
                                (Output,local_68._Begin,local_68._Used,&local_40);
              if ((eVar6 == 0) && (local_40 != *Rendered_00)) {
                __assert_fail("Err!=ERR_NONE || (filepos_t)Written == *Rendered",
                              "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                              ,0x20a,
                              "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                             );
              }
              *Rendered_00 = local_40 + local_48;
            }
          }
          StreamClose(Output_00);
        }
      }
      else {
        if (Output == (stream *)0x0) {
          __assert_fail("(const void*)(Output)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                        ,0x213,
                        "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                       );
        }
        lVar5 = (**(code **)((long)(Output->Base).VMT + 0x78))(Output,6,1);
        eVar6 = InternalRender((ebml_master *)(Element->Base).Base.Children,Output,
                               bForceWithoutMandatory,bVar3,ForProfile,(filepos_t *)Rendered_00);
        if (eVar6 == 0) {
          (**(code **)((long)(Output->Base).VMT + 0x18))(Output,0x102,&local_78,8);
          (**(code **)((long)(Output->Base).VMT + 0x18))(Output,0x101,&local_48);
          peVar4 = local_50;
          EBML_CRCAddBuffer(local_50,(void *)((lVar5 - local_78) + local_48),
                            (Element->Base).DataSize - 6);
          EBML_CRCFinalize(peVar4);
          pcVar1 = *(code **)((long)(Output->Base).VMT + 0x78);
          fVar7 = EBML_ElementPositionData(&Element->Base);
          (*pcVar1)(Output,fVar7,0);
          eVar6 = EBML_ElementRender(&peVar4->Base,Output,local_70,0,bForceWithoutMandatory,
                                     ForProfile,&local_78);
          *Rendered_00 = *Rendered_00 + local_78;
          pcVar1 = *(code **)((long)(Output->Base).VMT + 0x78);
          fVar7 = EBML_ElementPositionEnd(&Element->Base);
          (*pcVar1)(Output,fVar7,0);
        }
      }
      NodeDelete((node *)local_50);
      goto LAB_001181e5;
    }
  }
  eVar6 = -2;
LAB_001181e5:
  ArrayClear(&local_68);
  return eVar6;
}

Assistant:

static err_t RenderData(ebml_master *Element, struct stream *Output, bool_t bForceWithoutMandatory, bool_t bWithDefault, int ForProfile, filepos_t *Rendered)
{
    filepos_t _Rendered;
    err_t Err = ERR_NONE;

    if (!Rendered)
        Rendered = &_Rendered;
    *Rendered = 0;

	if (!bForceWithoutMandatory) {
		assert(CheckMandatory((ebml_master*)Element, bWithDefault, ForProfile));
	}

	if (!Element->CheckSumStatus)
        Err = InternalRender(Element, Output, bForceWithoutMandatory, bWithDefault, ForProfile, Rendered);
	else
    {
        // render to memory, compute the CRC, write the CRC and then the virtual data
#define CRC_EBML_SIZE  6
        array TmpBuf;
        bool_t IsMemory = Node_IsPartOf(Output,MEMSTREAM_CLASS);
        ArrayInit(&TmpBuf);
        if (!IsMemory &&
#if MAX_FILEPOS >= SIZE_MAX
            ((filepos_t)(Element->Base.DataSize - CRC_EBML_SIZE) > (filepos_t)SIZE_MAX
#else
            ((size_t)(Element->Base.DataSize - CRC_EBML_SIZE) > (size_t)SIZE_MAX
#endif
             || !ArrayResize(&TmpBuf, (size_t)Element->Base.DataSize - CRC_EBML_SIZE, 0)))
            Err = ERR_OUT_OF_MEMORY;
        else
        {
            ebml_crc *CrcElt = (ebml_crc*)EBML_ElementCreate(Element, EBML_getContextEbmlCrc32(), 0, ForProfile);
            if (!CrcElt)
                Err = ERR_OUT_OF_MEMORY;
            else
            {
                if (!IsMemory)
                {
                    stream *VOutput = (struct stream*)NodeCreate(Element, MEMSTREAM_CLASS);
                    if (!VOutput)
                        Err = ERR_OUT_OF_MEMORY;
                    else
                    {
                        filepos_t Offset = Stream_Seek(Output,0,SEEK_CUR) + CRC_EBML_SIZE;
                        Node_Set(VOutput, MEMSTREAM_DATA, ARRAYBEGIN(TmpBuf,uint8_t), ARRAYCOUNT(TmpBuf,uint8_t));
                        Node_SET(VOutput, MEMSTREAM_OFFSET, &Offset);
                        Err = InternalRender(Element, VOutput, bForceWithoutMandatory, bWithDefault, ForProfile, Rendered);
                        assert(Err!=ERR_NONE || *Rendered == (filepos_t)ARRAYCOUNT(TmpBuf,uint8_t));
                        if (Err==ERR_NONE)
                        {
                            filepos_t CrcSize;
                            EBML_CRCAddBuffer(CrcElt, ARRAYBEGIN(TmpBuf,uint8_t), ARRAYCOUNT(TmpBuf,uint8_t));
                            EBML_CRCFinalize(CrcElt);
                            Err = EBML_ElementRender((ebml_element*)CrcElt, Output, bWithDefault, 0, bForceWithoutMandatory, ForProfile, &CrcSize);
                            if (Err==ERR_NONE)
                            {
                                size_t Written;
                                Err = Stream_Write(Output, ARRAYBEGIN(TmpBuf,uint8_t), ARRAYCOUNT(TmpBuf,uint8_t), &Written);
                                assert(Err!=ERR_NONE || (filepos_t)Written == *Rendered);
                                *Rendered = Written + CrcSize;
                            }
                        }
                        StreamClose(VOutput);
                    }
                }
                else
                {
                    filepos_t VirtualPos = Stream_Seek(Output,CRC_EBML_SIZE,SEEK_CUR); // pass the CRC for now
                    Err = InternalRender(Element, Output, bForceWithoutMandatory, bWithDefault, ForProfile, Rendered);
                    if (Err==ERR_NONE)
                    {
                        filepos_t CrcSize;
                        uint8_t *Data;
                        Node_GET(Output,MEMSTREAM_OFFSET,&CrcSize);
                        Node_GET(Output,MEMSTREAM_PTR,&Data);
                        EBML_CRCAddBuffer(CrcElt, Data + (VirtualPos - CrcSize), (size_t)Element->Base.DataSize-CRC_EBML_SIZE);
                        EBML_CRCFinalize(CrcElt);
                        Stream_Seek(Output,EBML_ElementPositionData((ebml_element*)Element),SEEK_SET);
                        Err = EBML_ElementRender((ebml_element*)CrcElt, Output, bWithDefault, 0, bForceWithoutMandatory, ForProfile, &CrcSize);
                        *Rendered = *Rendered + CrcSize;
                        Stream_Seek(Output,EBML_ElementPositionEnd((ebml_element*)Element),SEEK_SET);
                    }
                }
                NodeDelete((node*)CrcElt);
            }
        }
        ArrayClear(&TmpBuf);
	}

	return Err;
}